

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_encode_with_controls_version1_controls_are_omitted_Test::TestBody
          (SubscriptionSyncTest_test_encode_with_controls_version1_controls_are_omitted_Test *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  long *__dest;
  char *message;
  size_type __dnew;
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  SubscriptionSync subscription_sync;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_d0;
  ByteBuffer local_b8 [48];
  code *local_88 [4];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  local_68;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_38;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_d0,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync
            ((SubscriptionSync *)local_88,0x7b,&local_d0);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_d0);
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_88,REFRESH);
  bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_88,TOGGLE);
  bidfx_public_api::price::pixie::SubscriptionSync::Encode((int)local_b8);
  local_100._M_dataplus._M_p = (pointer)0x44;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  __dest = (long *)std::__cxx11::string::_M_create((ulong *)&local_120,(ulong)&local_100);
  _Var1._M_p = local_100._M_dataplus._M_p;
  local_120.field_2._M_allocated_capacity = (size_type)local_100._M_dataplus._M_p;
  local_120._M_dataplus._M_p = (pointer)__dest;
  memcpy(__dest,"S",0x44);
  local_120._M_string_length = (size_type)_Var1._M_p;
  *((long)__dest + _Var1._M_p) = '\0';
  bidfx_public_api::tools::BufferUtil::BufferAsString_abi_cxx11_((ByteBuffer *)&local_100);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_e0,
             "\"S\\000\\173\\002\\004\\011Quantity\\0102500000\\007Symbol\\007EURGBP\\004\\011Quantity\\0105600000\\007Symbol\\007USDJPY\"s"
             ,"BufferUtil::BufferAsString(buffer)",&local_120,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,(ulong)(local_120.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0xa4,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_120._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
      local_120._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_b8);
  local_88[0] = bidfx_public_api::price::pixie::WelcomeMessage::operator==;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_38);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~_Rb_tree(&local_68);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_encode_with_controls_version1_controls_are_omitted)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    subscription_sync.AddControl(0, ControlOperationEnum::REFRESH);
    subscription_sync.AddControl(1, ControlOperationEnum::TOGGLE);

    ByteBuffer buffer = subscription_sync.Encode(PixieVersion::VERSION1);
    ASSERT_EQ("S\000\173\002\004\011Quantity\0102500000\007Symbol\007EURGBP\004\011Quantity\0105600000\007Symbol\007USDJPY"s, BufferUtil::BufferAsString(buffer));
}